

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWriter.cpp
# Opt level: O0

JsonWriter * __thiscall Corrade::Utility::JsonWriter::beginObject(JsonWriter *this)

{
  unsigned_long uVar1;
  ulong uVar2;
  Array<char,_void_(*)(char_*,_unsigned_long)> *array;
  ostream *output;
  Debug *this_00;
  Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
  *pAVar3;
  Pair<unsigned_long,_unsigned_long> *pPVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  type values;
  undefined8 local_68;
  long local_60;
  type_conflict3 local_55 [20];
  Flags local_41;
  Error local_40;
  State *local_18;
  State *state;
  JsonWriter *this_local;
  
  state = (State *)this;
  local_18 = Containers::Pointer<Corrade::Utility::JsonWriter::State>::operator*(&this->_state);
  if (((local_18->expecting != Value) && (local_18->expecting != ObjectValue)) &&
     (local_18->expecting != ArrayValueOrArrayEnd)) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Error::Error(&local_40,output,local_41);
    this_00 = Debug::operator<<(&local_40.super_Debug,"Utility::JsonWriter::beginObject(): expected"
                               );
    Debug::operator<<(this_00,*(char **)((anonymous_namespace)::ExpectingString +
                                        (long)(int)local_18->expecting * 8));
    Error::~Error(&local_40);
    abort();
  }
  writeCommaNewlineIndentInternal(this);
  local_55[0] = '{';
  Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
            (&local_18->out,local_55);
  pAVar3 = &local_18->levels;
  pPVar4 = Containers::
           Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
           ::back(&local_18->levels);
  puVar5 = Containers::Pair<unsigned_long,_unsigned_long>::first(pPVar4);
  uVar1 = *puVar5;
  sVar6 = Containers::ArrayView<const_char>::size(&local_18->indentation);
  local_60 = uVar1 + sVar6;
  local_68 = 0xffffffffffffffff;
  pPVar4 = Containers::
           arrayAppend<Corrade::Containers::Pair<unsigned_long,unsigned_long>,unsigned_long,unsigned_long>
                     (pAVar3,&local_60,&local_68);
  puVar5 = Containers::Pair<unsigned_long,_unsigned_long>::first(pPVar4);
  uVar2 = *puVar5;
  sVar6 = Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::size(&local_18->whitespace);
  if (sVar6 < uVar2) {
    array = (Array<char,_void_(*)(char_*,_unsigned_long)> *)(local_18->indentation)._data;
    values._size = (size_t)array;
    values._data = (char *)(local_18->indentation)._size;
    Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
              ((Containers *)&local_18->whitespace,array,values);
  }
  local_18->expecting = ObjectKeyOrEnd;
  local_18->needsCommaBefore = false;
  return this;
}

Assistant:

JsonWriter& JsonWriter::beginObject() {
    State& state = *_state;
    CORRADE_ASSERT(
        state.expecting == Expecting::Value ||
        state.expecting == Expecting::ObjectValue ||
        state.expecting == Expecting::ArrayValueOrArrayEnd,
        "Utility::JsonWriter::beginObject(): expected" << ExpectingString[int(state.expecting)], *this);

    /* Comma, newline and indent, object opening brace */
    writeCommaNewlineIndentInternal();
    arrayAppend(state.out, '{');

    /* Indent next level further; mark this as an object */
    if(arrayAppend(state.levels, InPlaceInit, state.levels.back().first() + state.indentation.size(), ~std::size_t{}).first() > state.whitespace.size())
        arrayAppend(state.whitespace, state.indentation);

    /* Next expectig an object key or end */
    state.expecting = Expecting::ObjectKeyOrEnd;
    state.needsCommaBefore = false;

    return *this;
}